

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::(anonymous_namespace)::
     convert_buffer_generic<pugi::impl::(anonymous_namespace)::utf32_decoder<pugi::impl::(anonymous_namespace)::opt_true>>
               (long *out_buffer,long *out_length,undefined8 contents,ulong size)

{
  value_type vVar1;
  long lVar2;
  value_type puVar3;
  uint8_t *oend;
  uint8_t *obegin;
  char_t *buffer;
  size_t length;
  size_t data_length;
  type *data;
  size_t size_local;
  void *contents_local;
  size_t *out_length_local;
  char_t **out_buffer_local;
  
  vVar1 = anon_unknown_0::utf32_decoder<pugi::impl::(anonymous_namespace)::opt_true>::
          process<pugi::impl::(anonymous_namespace)::utf8_counter>(contents,size >> 2,0);
  lVar2 = (*(code *)xml_memory_management_function_storage<int>::allocate)(vVar1 + 1);
  if (lVar2 == 0) {
    out_buffer_local._7_1_ = false;
  }
  else {
    puVar3 = anon_unknown_0::utf32_decoder<pugi::impl::(anonymous_namespace)::opt_true>::
             process<pugi::impl::(anonymous_namespace)::utf8_writer>(contents,size >> 2,lVar2);
    if (puVar3 != (value_type)(lVar2 + vVar1)) {
      __assert_fail("oend == obegin + length",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                    ,0x8b1,
                    "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
                   );
    }
    *puVar3 = '\0';
    *out_buffer = lVar2;
    *out_length = vVar1 + 1;
    out_buffer_local._7_1_ = true;
  }
  return out_buffer_local._7_1_;
}

Assistant:

PUGI_IMPL_FN bool convert_buffer_generic(char_t*& out_buffer, size_t& out_length, const void* contents, size_t size, D)
	{
		const typename D::type* data = static_cast<const typename D::type*>(contents);
		size_t data_length = size / sizeof(typename D::type);

		// first pass: get length in utf8 units
		size_t length = D::process(data, data_length, 0, utf8_counter());

		// allocate buffer of suitable length
		char_t* buffer = static_cast<char_t*>(xml_memory::allocate((length + 1) * sizeof(char_t)));
		if (!buffer) return false;

		// second pass: convert utf16 input to utf8
		uint8_t* obegin = reinterpret_cast<uint8_t*>(buffer);
		uint8_t* oend = D::process(data, data_length, obegin, utf8_writer());

		assert(oend == obegin + length);
		*oend = 0;

		out_buffer = buffer;
		out_length = length + 1;

		return true;
	}